

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void testing::internal::XmlUnitTestResultPrinter::OutputXmlCDataSection(ostream *stream,char *data)

{
  long lVar1;
  char *pcVar2;
  size_t sVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::__ostream_insert<char,std::char_traits<char>>(stream,"<![CDATA[",9);
  do {
    pcVar2 = strstr(data,"]]>");
    if (pcVar2 == (char *)0x0) {
      if (data == (char *)0x0) {
        std::ios::clear((int)stream + (int)*(undefined8 *)(*(long *)stream + -0x18));
      }
      else {
        sVar3 = strlen(data);
        std::__ostream_insert<char,std::char_traits<char>>(stream,data,sVar3);
      }
    }
    else {
      std::ostream::write((char *)stream,(long)data);
      std::__ostream_insert<char,std::char_traits<char>>(stream,"]]>]]&gt;<![CDATA[",0x12);
      data = pcVar2 + 3;
    }
  } while (pcVar2 != (char *)0x0);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    std::__ostream_insert<char,std::char_traits<char>>(stream,"]]>",3);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void XmlUnitTestResultPrinter::OutputXmlCDataSection(::std::ostream* stream,
                                                     const char* data) {
  const char* segment = data;
  *stream << "<![CDATA[";
  for (;;) {
    const char* const next_segment = strstr(segment, "]]>");
    if (next_segment != NULL) {
      stream->write(
          segment, static_cast<std::streamsize>(next_segment - segment));
      *stream << "]]>]]&gt;<![CDATA[";
      segment = next_segment + strlen("]]>");
    } else {
      *stream << segment;
      break;
    }
  }
  *stream << "]]>";
}